

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
CorruptInternalNodes_ChildClaimsToBeOnHeap_Test::TestBody
          (CorruptInternalNodes_ChildClaimsToBeOnHeap_Test *this)

{
  index_pointer *piVar1;
  index_pointer node;
  shared_ptr<pstore::index::details::internal_node> inode;
  transaction_type t1;
  undefined1 local_68 [8];
  bool local_60;
  undefined7 uStack_5f;
  transaction_base local_58;
  
  local_68 = (undefined1  [8])
             &(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.
              field_0x10;
  local_60 = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_68);
  local_60 = true;
  node.internal_ = (internal_node *)&local_58;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)node.internal_,
             &(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.db_,
             (lock_type *)local_68);
  anon_unknown.dwarf_18bb43::CorruptInternalNodes::build
            (&this->super_CorruptInternalNodes,(transaction_type *)node.internal_);
  anon_unknown.dwarf_18bb43::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)
             (((this->super_CorruptInternalNodes).index_._M_t.
               super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
              ._M_head_impl)->root_).internal_,node);
  anon_unknown.dwarf_18bb43::CorruptInternalNodes::load_inode
            ((CorruptInternalNodes *)local_68,(index_pointer)this);
  piVar1 = pstore::index::details::internal_node::operator[]((internal_node *)local_68,0);
  if (((ulong)piVar1->internal_ & 2) == 0) {
    piVar1->internal_ = (internal_node *)((ulong)piVar1->internal_ | 3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_5f,local_60) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_5f,local_60));
    }
    pstore::transaction_base::commit(&local_58);
    local_58._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340;
    pstore::transaction_base::rollback(&local_58);
    anon_unknown.dwarf_18bb43::CorruptInternalNodes::iterate(&this->super_CorruptInternalNodes);
    anon_unknown.dwarf_18bb43::CorruptInternalNodes::find(&this->super_CorruptInternalNodes);
    return;
  }
  __assert_fail("is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
}

Assistant:

TEST_F (CorruptInternalNodes, ChildClaimsToBeOnHeap) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->build (t1);

        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        // Corrupt the first child field such it claims to be on the heap.
        {
            std::shared_ptr<internal_node> inode = this->load_inode (root);
            index_pointer & first = (*inode)[0];
            first =
                index_pointer{reinterpret_cast<internal_node *> (first.to_address ().absolute ())};
        }
        t1.commit ();
    }
    this->iterate ();
    this->find ();
}